

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  long *plVar2;
  mapped_type *pmVar3;
  LogMessage *other;
  long *plVar4;
  size_type *psVar5;
  int iVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  long lVar10;
  string error;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  key_type local_10c;
  EnumDescriptorProto *local_108;
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  DescriptorBuilder *local_a0;
  long *local_98;
  char *local_90;
  long local_88;
  _Alloc_hider _Stack_80;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_108 = proto;
  local_a0 = this;
  if (0 < *(int *)(enm + 0x2c)) {
    iVar6 = 0;
    do {
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                (&(proto->value_).super_RepeatedPtrFieldBase,iVar6);
      iVar6 = iVar6 + 1;
    } while (iVar6 < *(int *)(enm + 0x2c));
  }
  if (((*(byte *)(*(long *)(enm + 0x20) + 0x48) & 1) == 0) ||
     (*(char *)(*(long *)(enm + 0x20) + 0x68) == '\0')) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < *(int *)(enm + 0x2c)) {
      lVar10 = 0;
      do {
        p_Var9 = &local_60._M_impl.super__Rb_tree_header;
        iVar6 = *(int *)(*(long *)(enm + 0x30) + 0x10 + lVar10 * 0x28);
        p_Var7 = &p_Var9->_M_header;
        for (p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
            p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < iVar6]) {
          if (iVar6 <= (int)*(size_t *)(p_Var8 + 1)) {
            p_Var7 = p_Var8;
          }
        }
        p_Var8 = &p_Var9->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var9) &&
           (p_Var8 = p_Var7, iVar6 < (int)p_Var7[1]._M_color)) {
          p_Var8 = &p_Var9->_M_header;
        }
        lVar1 = *(long *)(enm + 0x30) + lVar10 * 0x28;
        if ((_Rb_tree_header *)p_Var8 == p_Var9) {
          local_98 = (long *)CONCAT44(local_98._4_4_,*(undefined4 *)(lVar1 + 0x10));
          pmVar3 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,(key_type *)&local_98);
          std::__cxx11::string::_M_assign((string *)pmVar3);
        }
        else {
          std::operator+(&local_c0,"\"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar1 + 8));
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
          plVar4 = plVar2 + 2;
          if ((long *)*plVar2 == plVar4) {
            local_d0 = *plVar4;
            lStack_c8 = plVar2[3];
            local_e0 = &local_d0;
          }
          else {
            local_d0 = *plVar4;
            local_e0 = (long *)*plVar2;
          }
          local_d8 = plVar2[1];
          *plVar2 = (long)plVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          local_10c = *(key_type *)(lVar1 + 0x10);
          pmVar3 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_10c);
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_e0,(ulong)(pmVar3->_M_dataplus)._M_p);
          plVar4 = plVar2 + 2;
          if ((long *)*plVar2 == plVar4) {
            local_88 = *plVar4;
            _Stack_80._M_p = (pointer)plVar2[3];
            local_98 = &local_88;
          }
          else {
            local_88 = *plVar4;
            local_98 = (long *)*plVar2;
          }
          local_90 = (char *)plVar2[1];
          *plVar2 = (long)plVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_100.field_2._M_allocated_capacity = *psVar5;
            local_100.field_2._8_8_ = plVar2[3];
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar5;
            local_100._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_100._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_e0 != &local_d0) {
            operator_delete(local_e0,local_d0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if (*(char *)(*(long *)(enm + 0x20) + 0x68) == '\0') {
            AddError(local_a0,*(string **)(enm + 8),&local_108->super_Message,NUMBER,&local_100);
          }
          else {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&local_98,LOGLEVEL_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1680);
            other = internal::LogMessage::operator<<((LogMessage *)&local_98,&local_100);
            internal::LogFinisher::operator=((LogFinisher *)&local_e0,other);
            internal::LogMessage::~LogMessage((LogMessage *)&local_98);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < *(int *)(enm + 0x2c));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    std::map<int, string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] + "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER,
                   error);
        } else {
          // Generate warning if duplicated values are found but the option
          // isn't set.
          GOOGLE_LOG(ERROR) << error;
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}